

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Irrlicht.cpp
# Opt level: O1

bool isDriverSupported(E_DRIVER_TYPE driver)

{
  return (bool)(0x23U >> ((byte)driver & 0x1f) & driver < EDT_COUNT);
}

Assistant:

IRRLICHT_API bool IRRCALLCONV isDriverSupported(E_DRIVER_TYPE driver)
{
	switch (driver) {
	case EDT_NULL:
		return true;
#ifdef ENABLE_OPENGL3
	case EDT_OPENGL3:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_OPENGL_
	case EDT_OPENGL:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_OGLES1_
	case EDT_OGLES1:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_OGLES2_
	case EDT_OGLES2:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_WEBGL1_
	case EDT_WEBGL1:
		return true;
#endif
	default:
		return false;
	}
}